

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaCuFunc.cpp
# Opt level: O0

void __thiscall NaCustomFunc::Save(NaCustomFunc *this,NaDataStream *ds)

{
  NaDataStream *this_00;
  uint uVar1;
  NaVector *__dest;
  size_t sVar2;
  NaReal *pNVar3;
  NaDataStream *in_RSI;
  long in_RDI;
  uint i;
  char *buffer;
  undefined8 in_stack_ffffffffffffff98;
  uint i_00;
  NaVector *in_stack_ffffffffffffffa0;
  NaVector *this_01;
  uint local_1c;
  
  if (*(long *)(in_RDI + 0x40) != 0) {
    NaDataStream::PutF(in_RSI,(char *)0x0,"file    %s",*(undefined8 *)(in_RDI + 0x40));
  }
  if (*(long *)(in_RDI + 0x48) != 0) {
    NaDataStream::PutF(in_RSI,(char *)0x0,"options %s",*(undefined8 *)(in_RDI + 0x48));
  }
  uVar1 = NaVector::dim((NaVector *)(in_RDI + 0x50));
  i_00 = (uint)((ulong)in_stack_ffffffffffffff98 >> 0x20);
  if (uVar1 != 0) {
    if (uVar1 == 1) {
      pNVar3 = NaVector::operator[](in_stack_ffffffffffffffa0,i_00);
      NaDataStream::PutF((NaDataStream *)*pNVar3,(char *)in_RSI,(char *)0x0,"initial %g");
    }
    else if (uVar1 == 2) {
      pNVar3 = NaVector::operator[](in_stack_ffffffffffffffa0,i_00);
      this_00 = (NaDataStream *)*pNVar3;
      pNVar3 = NaVector::operator[](in_stack_ffffffffffffffa0,i_00);
      NaDataStream::PutF(this_00,(char *)*pNVar3,(char *)in_RSI,0,"initial %g %g");
    }
    else {
      uVar1 = NaVector::dim((NaVector *)(in_RDI + 0x50));
      __dest = (NaVector *)operator_new__((ulong)(uVar1 * 0x1e + 8));
      strcpy((char *)__dest,"initial");
      for (local_1c = 0; uVar1 = NaVector::dim((NaVector *)(in_RDI + 0x50)), local_1c < uVar1;
          local_1c = local_1c + 1) {
        this_01 = __dest;
        sVar2 = strlen((char *)__dest);
        pNVar3 = NaVector::operator[](this_01,(uint)((ulong)in_stack_ffffffffffffff98 >> 0x20));
        sprintf((char *)((long)&this_01->_vptr_NaVector + sVar2)," %g",*pNVar3);
      }
      NaDataStream::PutF(in_RSI,(char *)0x0,"%s",__dest);
      if (__dest != (NaVector *)0x0) {
        operator_delete__(__dest);
      }
    }
  }
  return;
}

Assistant:

void
NaCustomFunc::Save (NaDataStream& ds)
{
  if(NULL != szFile)
    ds.PutF(NULL, "file    %s", szFile);
  if(NULL != szOptions)
    ds.PutF(NULL, "options %s", szOptions);

  switch(vInitial.dim()){
  case 0:
    // nothing
    break;

  case 1:
    // economic mode
    ds.PutF(NULL, "initial %g", vInitial[0]);
    break;

  case 2:
    // economic mode
    ds.PutF(NULL, "initial %g %g", vInitial[0], vInitial[1]);
    break;

  default:
    // expensive mode
    {
      char	*buffer = new char[8 + vInitial.dim() * 30];
      unsigned	i;
      strcpy(buffer, "initial");
      for(i = 0; i < vInitial.dim(); ++i){
	sprintf(buffer + strlen(buffer), " %g", vInitial[i]);
      }
      ds.PutF(NULL, "%s", buffer);
      delete[] buffer;
    }
    break;
  }
}